

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_ev.c
# Opt level: O0

CURLMcode mev_forget_socket(Curl_multi *multi,Curl_easy *data,curl_socket_t s,char *cause)

{
  mev_sh_entry *pmVar1;
  int local_3c;
  int rc;
  mev_sh_entry *entry;
  char *cause_local;
  curl_socket_t s_local;
  Curl_easy *data_local;
  Curl_multi *multi_local;
  
  pmVar1 = mev_sh_entry_get(&(multi->ev).sh_entries,s);
  local_3c = 0;
  if (pmVar1 == (mev_sh_entry *)0x0) {
    multi_local._4_4_ = CURLM_OK;
  }
  else {
    if (multi->socket_cb != (curl_socket_callback)0x0) {
      if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0))
          && (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))
          ) && (0 < Curl_trc_feat_multi.log_level)) {
        Curl_trc_multi(data,"ev %s, call(fd=%d, ev=REMOVE)",cause,(ulong)(uint)s);
      }
      mev_in_callback(multi,true);
      local_3c = (*multi->socket_cb)(data,s,4,multi->socket_userp,pmVar1->user_data);
      mev_in_callback(multi,false);
    }
    mev_sh_entry_kill(multi,s);
    if (local_3c == -1) {
      multi->field_0x271 = multi->field_0x271 & 0xef | 0x10;
      multi_local._4_4_ = CURLM_ABORTED_BY_CALLBACK;
    }
    else {
      multi_local._4_4_ = CURLM_OK;
    }
  }
  return multi_local._4_4_;
}

Assistant:

static CURLMcode mev_forget_socket(struct Curl_multi *multi,
                                   struct Curl_easy *data,
                                   curl_socket_t s,
                                   const char *cause)
{
  struct mev_sh_entry *entry = mev_sh_entry_get(&multi->ev.sh_entries, s);
  int rc = 0;

  if(!entry) /* we never knew or already forgot about this socket */
    return CURLM_OK;

  /* We managed this socket before, tell the socket callback to forget it. */
  if(multi->socket_cb) {
    CURL_TRC_M(data, "ev %s, call(fd=%" FMT_SOCKET_T ", ev=REMOVE)",
               cause, s);
    mev_in_callback(multi, TRUE);
    rc = multi->socket_cb(data, s, CURL_POLL_REMOVE,
                          multi->socket_userp, entry->user_data);
    mev_in_callback(multi, FALSE);
  }

  mev_sh_entry_kill(multi, s);
  if(rc == -1) {
    multi->dead = TRUE;
    return CURLM_ABORTED_BY_CALLBACK;
  }
  return CURLM_OK;
}